

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::DisposeObjects(LargeHeapBlock *this,Recycler *recycler)

{
  LargeObjectHeader *this_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  LargeObjectHeader *pLVar5;
  LargeObjectHeader **ppLVar6;
  long *plVar7;
  bool local_29;
  bool objectTrimmed;
  void *objectAddress;
  LargeObjectHeader *header;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  if ((this->pendingDisposeObject == (LargeObjectHeader *)0x0) &&
     ((this->hasDisposeBeenCalled & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x806,
                       "(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled)",
                       "this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  do {
    if (this->pendingDisposeObject == (LargeObjectHeader *)0x0) {
      return;
    }
    this->hasDisposeBeenCalled = true;
    this_00 = this->pendingDisposeObject;
    pLVar5 = LargeObjectHeader::GetNext(this_00,this->heapInfo->recycler->Cookie);
    this->pendingDisposeObject = pLVar5;
    bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
    if ((bVar3 & 0x80) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x810,
                         "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)",
                         "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppLVar6 = HeaderList(this);
    if (ppLVar6[this_00->objectIndex] != (LargeObjectHeader *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x811,"(this->HeaderList()[header->objectIndex] == nullptr)",
                         "this->HeaderList()[header->objectIndex] == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    plVar7 = (long *)LargeObjectHeader::GetAddress(this_00);
    (**(code **)(*plVar7 + 8))(plVar7,0);
    if (this->finalizeCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x816,"(finalizeCount != 0)","finalizeCount != 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this->finalizeCount = this->finalizeCount - 1;
    local_29 = false;
    bVar2 = LargeHeapBucket::SupportFreeList(this->bucket);
    if (bVar2) {
      local_29 = TrimObject(this,recycler,this_00,this_00->objectSize,true);
    }
    if (local_29 == false) {
      FillFreeMemory(this,recycler,this_00,this_00->objectSize + 0x20);
    }
    (recycler->collectionStats).finalizeSweepCount =
         (recycler->collectionStats).finalizeSweepCount + 1;
    this->heapInfo->liveFinalizableObjectCount = this->heapInfo->liveFinalizableObjectCount - 1;
    this->heapInfo->pendingDisposableObjectCount = this->heapInfo->pendingDisposableObjectCount - 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::DisposeObjects(Recycler * recycler)
{
    Assert(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled);

    while (pendingDisposeObject != nullptr)
    {
#if DBG
        this->hasDisposeBeenCalled = true;
#endif

        LargeObjectHeader * header = pendingDisposeObject;
        pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
        Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
        Assert(this->HeaderList()[header->objectIndex] == nullptr);

        void * objectAddress = header->GetAddress();
        ((FinalizableObject *)objectAddress)->Dispose(false);

        Assert(finalizeCount != 0);
        finalizeCount--;

        bool objectTrimmed = false;

        if (this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, header->objectSize, true /* need suspend */);
        }

        // GCTODO: Consider free listing items after Dispose too
        // GCTODO: Consider compacting heap blocks- if the last n items are free, move the address pointer
        // back to before the nth item so we can bump allocate from this heap block
        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }

        RECYCLER_STATS_INC(recycler, finalizeSweepCount);
#ifdef RECYCLER_FINALIZE_CHECK
        this->heapInfo->liveFinalizableObjectCount--;
        this->heapInfo->pendingDisposableObjectCount--;
#endif
    }
}